

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

void __thiscall QJsonValueRef::detach(QJsonValueRef *this)

{
  QCborContainerPrivate *pQVar1;
  
  pQVar1 = (((this->super_QJsonValueConstRef).field_0.a)->a).d.ptr;
  pQVar1 = QCborContainerPrivate::detach(pQVar1,(pQVar1->elements).d.size);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
            (&((this->super_QJsonValueConstRef).field_0.a)->a,pQVar1);
  return;
}

Assistant:

void QJsonValueRef::detach()
{
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
    QCborContainerPrivate *d = QJsonPrivate::Value::container(*this);
    d = QCborContainerPrivate::detach(d, d->elements.size());

    if (is_object)
        o->o.reset(d);
    else
        a->a.reset(d);
#else
    d = QCborContainerPrivate::detach(d, d->elements.size());
#endif
}